

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O1

void __thiscall rpc_tests::rpc_format_monetary_values::test_method(rpc_format_monetary_values *this)

{
  char *pcVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  check_type cVar5;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  assertion_result local_2e8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  lazy_ostream local_120;
  undefined1 *local_110;
  char **local_108;
  UniValue *local_100;
  char *local_f8;
  char *local_f0;
  assertion_result local_e8;
  undefined1 local_d0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<UniValue,_std::allocator<UniValue>_> local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  local_48._16_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xe5;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0);
  ::UniValue::write_abi_cxx11_
            ((UniValue *)local_58,(int)(UniValue *)(local_d0 + 0x20),(void *)0x0,0);
  _cVar5 = 0x5712c8;
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "0.00000000");
  local_2e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2e8.m_message.px = (element_type *)0x0;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "ValueFromAmount(0LL).write() == \"0.00000000\"";
  local_d0._8_8_ = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_150 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_108 = (char **)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_120,1,0,WARN,_cVar5,(size_t)&local_158,0xe5);
  boost::detail::shared_count::~shared_count(&local_2e8.m_message.pn);
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xe6;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  ValueFromAmount((UniValue *)(local_d0 + 0x20),1);
  ::UniValue::write_abi_cxx11_
            ((UniValue *)local_58,(int)(UniValue *)(local_d0 + 0x20),(void *)0x0,0);
  _cVar5 = 0x571434;
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "0.00000001");
  local_2e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2e8.m_message.px = (element_type *)0x0;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "ValueFromAmount(1LL).write() == \"0.00000001\"";
  local_d0._8_8_ = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_180 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_108 = (char **)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_120,1,0,WARN,_cVar5,(size_t)&local_188,0xe6);
  boost::detail::shared_count::~shared_count(&local_2e8.m_message.pn);
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xe7;
  file_01.m_begin = (iterator)&local_198;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0x10ce4b3);
  ::UniValue::write_abi_cxx11_
            ((UniValue *)local_58,(int)(UniValue *)(local_d0 + 0x20),(void *)0x0,0);
  _cVar5 = 0x571594;
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "0.17622195");
  local_2e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2e8.m_message.px = (element_type *)0x0;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "ValueFromAmount(17622195LL).write() == \"0.17622195\"";
  local_d0._8_8_ = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1b0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_108 = (char **)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_120,1,0,WARN,_cVar5,(size_t)&local_1b8,0xe7);
  boost::detail::shared_count::~shared_count(&local_2e8.m_message.pn);
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xe8;
  file_02.m_begin = (iterator)&local_1c8;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d8,
             msg_02);
  ValueFromAmount((UniValue *)(local_d0 + 0x20),50000000);
  ::UniValue::write_abi_cxx11_
            ((UniValue *)local_58,(int)(UniValue *)(local_d0 + 0x20),(void *)0x0,0);
  _cVar5 = 0x5716f4;
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "0.50000000");
  local_2e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2e8.m_message.px = (element_type *)0x0;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "ValueFromAmount(50000000LL).write() == \"0.50000000\"";
  local_d0._8_8_ = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1e0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_108 = (char **)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_120,1,0,WARN,_cVar5,(size_t)&local_1e8,0xe8);
  boost::detail::shared_count::~shared_count(&local_2e8.m_message.pn);
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xe9;
  file_03.m_begin = (iterator)&local_1f8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
             msg_03);
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0x55bbfed);
  ::UniValue::write_abi_cxx11_
            ((UniValue *)local_58,(int)(UniValue *)(local_d0 + 0x20),(void *)0x0,0);
  _cVar5 = 0x571854;
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "0.89898989");
  local_2e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2e8.m_message.px = (element_type *)0x0;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "ValueFromAmount(89898989LL).write() == \"0.89898989\"";
  local_d0._8_8_ = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_210 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_108 = (char **)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_120,1,0,WARN,_cVar5,(size_t)&local_218,0xe9);
  boost::detail::shared_count::~shared_count(&local_2e8.m_message.pn);
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xea;
  file_04.m_begin = (iterator)&local_228;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_238,
             msg_04);
  ValueFromAmount((UniValue *)(local_d0 + 0x20),100000000);
  ::UniValue::write_abi_cxx11_
            ((UniValue *)local_58,(int)(UniValue *)(local_d0 + 0x20),(void *)0x0,0);
  _cVar5 = 0x5719b4;
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "1.00000000");
  local_2e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2e8.m_message.px = (element_type *)0x0;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "ValueFromAmount(100000000LL).write() == \"1.00000000\"";
  local_d0._8_8_ = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_240 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_108 = (char **)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_120,1,0,WARN,_cVar5,(size_t)&local_248,0xea);
  boost::detail::shared_count::~shared_count(&local_2e8.m_message.pn);
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xeb;
  file_05.m_begin = (iterator)&local_258;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_268,
             msg_05);
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0x775f05a073ff6);
  ::UniValue::write_abi_cxx11_
            ((UniValue *)local_58,(int)(UniValue *)(local_d0 + 0x20),(void *)0x0,0);
  _cVar5 = 0x571b22;
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "20999999.99999990");
  local_2e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2e8.m_message.px = (element_type *)0x0;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "ValueFromAmount(2099999999999990LL).write() == \"20999999.99999990\"";
  local_d0._8_8_ = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_270 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_108 = (char **)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_120,1,0,WARN,_cVar5,(size_t)&local_278,0xeb);
  boost::detail::shared_count::~shared_count(&local_2e8.m_message.pn);
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xec;
  file_06.m_begin = (iterator)&local_288;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_298,
             msg_06);
  ValueFromAmount((UniValue *)(local_d0 + 0x20),2099999999999999);
  ::UniValue::write_abi_cxx11_
            ((UniValue *)local_58,(int)(UniValue *)(local_d0 + 0x20),(void *)0x0,0);
  _cVar5 = 0x571c93;
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "20999999.99999999");
  local_2e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2e8.m_message.px = (element_type *)0x0;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "ValueFromAmount(2099999999999999LL).write() == \"20999999.99999999\"";
  local_d0._8_8_ = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2a0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_108 = (char **)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e8,&local_120,1,0,WARN,_cVar5,(size_t)&local_2a8,0xec);
  boost::detail::shared_count::~shared_count(&local_2e8.m_message.pn);
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xee;
  file_07.m_begin = (iterator)&local_2b8;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c8,
             msg_07);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "0.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_48._8_8_ = &local_100;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_128 = "0.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec0db4,(size_t)&local_f8,0xee,
             local_58,"\"0.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  pcVar1 = local_d0 + 0x10;
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xef;
  file_08.m_begin = (iterator)&local_2f8;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_308,
             msg_08);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0x11f71fb0450);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "12345.67890000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "12345.67890000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec0dcf,(size_t)&local_f8,0xef,
             local_58,"\"12345.67890000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xf0;
  file_09.m_begin = (iterator)&local_318;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_328,
             msg_09);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),-100000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "-1.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "-1.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad400;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec0e1f,(size_t)&local_f8,0xf0,
             local_58,"\"-1.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xf1;
  file_10.m_begin = (iterator)&local_338;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_348,
             msg_10);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),-10000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "-0.10000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "-0.10000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad400;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec0e58,(size_t)&local_f8,0xf1,
             local_58,"\"-0.10000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xf3;
  file_11.m_begin = (iterator)&local_358;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_368,
             msg_11);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),10000000000000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "100000000.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "100000000.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abf10;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec0e94,(size_t)&local_f8,0xf3,
             local_58,"\"100000000.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xf4;
  file_12.m_begin = (iterator)&local_378;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_388,
             msg_12);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),1000000000000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "10000000.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "10000000.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad380;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec0ee4,(size_t)&local_f8,0xf4,
             local_58,"\"10000000.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xf5;
  file_13.m_begin = (iterator)&local_398;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3a8,
             msg_13);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),100000000000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "1000000.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "1000000.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af110;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec0f31,(size_t)&local_f8,0xf5,
             local_58,"\"1000000.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xf6;
  file_14.m_begin = (iterator)&local_3b8;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3c8,
             msg_14);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),10000000000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "100000.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "100000.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad3c0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec0f7b,(size_t)&local_f8,0xf6,
             local_58,"\"100000.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xf7;
  file_15.m_begin = (iterator)&local_3d8;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3e8,
             msg_15);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),1000000000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "10000.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "10000.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcb0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec0fc2,(size_t)&local_f8,0xf7,
             local_58,"\"10000.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xf8;
  file_16.m_begin = (iterator)&local_3f8;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_408,
             msg_16);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),100000000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "1000.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "1000.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af150;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec1006,(size_t)&local_f8,0xf8,
             local_58,"\"1000.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xf9;
  file_17.m_begin = (iterator)&local_418;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_428,
             msg_17);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),10000000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "100.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "100.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abd30;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec1047,(size_t)&local_f8,0xf9,
             local_58,"\"100.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xfa;
  file_18.m_begin = (iterator)&local_438;
  msg_18.m_end = pvVar4;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_448,
             msg_18);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),1000000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "10.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "10.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad400;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec1085,(size_t)&local_f8,0xfa,
             local_58,"\"10.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xfb;
  file_19.m_begin = (iterator)&local_458;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_468,
             msg_19);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),100000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "1.00000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "1.00000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec10c0,(size_t)&local_f8,0xfb,
             local_58,"\"1.00000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xfc;
  file_20.m_begin = (iterator)&local_478;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_488,
             msg_20);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),10000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "0.10000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "0.10000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec10de,(size_t)&local_f8,0xfc,
             local_58,"\"0.10000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0xfd;
  file_21.m_begin = (iterator)&local_498;
  msg_21.m_end = pvVar4;
  msg_21.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4a8,
             msg_21);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),1000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "0.01000000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "0.01000000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec110c,(size_t)&local_f8,0xfd,
             local_58,"\"0.01000000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0xfe;
  file_22.m_begin = (iterator)&local_4b8;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_4c8,
             msg_22);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),100000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "0.00100000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "0.00100000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec1146,(size_t)&local_f8,0xfe,
             local_58,"\"0.00100000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0xff;
  file_23.m_begin = (iterator)&local_4d8;
  msg_23.m_end = pvVar4;
  msg_23.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_4e8,
             msg_23);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),10000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "0.00010000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "0.00010000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec1181,(size_t)&local_f8,0xff,
             local_58,"\"0.00010000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x100;
  file_24.m_begin = (iterator)&local_4f8;
  msg_24.m_end = pvVar4;
  msg_24.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_508,
             msg_24);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),1000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "0.00001000");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "0.00001000";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec11bd,(size_t)&local_f8,0x100,
             local_58,"\"0.00001000\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x101;
  file_25.m_begin = (iterator)&local_518;
  msg_25.m_end = pvVar4;
  msg_25.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_528,
             msg_25);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),100);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "0.00000100");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "0.00000100";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec11fa,(size_t)&local_f8,0x101,
             local_58,"\"0.00000100\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x102;
  file_26.m_begin = (iterator)&local_538;
  msg_26.m_end = pvVar4;
  msg_26.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_548,
             msg_26);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),10);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "0.00000010");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "0.00000010";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec1238,(size_t)&local_f8,0x102,
             local_58,"\"0.00000010\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x103;
  file_27.m_begin = (iterator)&local_558;
  msg_27.m_end = pvVar4;
  msg_27.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_568,
             msg_27);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),1);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "0.00000001");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "0.00000001";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad200;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec1277,(size_t)&local_f8,0x103,
             local_58,"\"0.00000001\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x105;
  file_28.m_begin = (iterator)&local_578;
  msg_28.m_end = pvVar4;
  msg_28.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_588,
             msg_28);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0x7fffffffffffffff);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "92233720368.54775807");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "92233720368.54775807";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af190;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec129f,(size_t)&local_f8,0x105,
             local_58,"\"92233720368.54775807\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x106;
  file_29.m_begin = (iterator)&local_598;
  msg_29.m_end = pvVar4;
  msg_29.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_5a8,
             msg_29);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0x7ffffffffffffffe);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "92233720368.54775806");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "92233720368.54775806";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af190;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec12f3,(size_t)&local_f8,0x106,
             local_58,"\"92233720368.54775806\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x107;
  file_30.m_begin = (iterator)&local_5b8;
  msg_30.m_end = pvVar4;
  msg_30.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_5c8,
             msg_30);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0x7ffffffffffffffd);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "92233720368.54775805");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "92233720368.54775805";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af190;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec134b,(size_t)&local_f8,0x107,
             local_58,"\"92233720368.54775805\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x108;
  file_31.m_begin = (iterator)&local_5d8;
  msg_31.m_end = pvVar4;
  msg_31.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_5e8,
             msg_31);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),0x7ffffffffffffffc);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "92233720368.54775804");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "92233720368.54775804";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af190;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec13a3,(size_t)&local_f8,0x108,
             local_58,"\"92233720368.54775804\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x10a;
  file_32.m_begin = (iterator)&local_5f8;
  msg_32.m_end = pvVar4;
  msg_32.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_608,
             msg_32);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),-0x7ffffffffffffffd);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "-92233720368.54775805");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "-92233720368.54775805";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af1d0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec1410,(size_t)&local_f8,0x10a,
             local_58,"\"-92233720368.54775805\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x10b;
  file_33.m_begin = (iterator)&local_618;
  msg_33.m_end = pvVar4;
  msg_33.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_628,
             msg_33);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),-0x7ffffffffffffffe);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "-92233720368.54775806");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "-92233720368.54775806";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af1d0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec147f,(size_t)&local_f8,0x10b,
             local_58,"\"-92233720368.54775806\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x10c;
  file_34.m_begin = (iterator)&local_638;
  msg_34.m_end = pvVar4;
  msg_34.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_648,
             msg_34);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),-0x7fffffffffffffff);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "-92233720368.54775807");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "-92233720368.54775807";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af1d0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec14ee,(size_t)&local_f8,0x10c,
             local_58,"\"-92233720368.54775807\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x10d;
  file_35.m_begin = (iterator)&local_658;
  msg_35.m_end = pvVar4;
  msg_35.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_668,
             msg_35);
  local_2e8.m_message.px = (element_type *)((ulong)local_2e8.m_message.px & 0xffffffffffffff00);
  local_2e8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0 = "";
  ValueFromAmount((UniValue *)(local_d0 + 0x20),-0x8000000000000000);
  ::UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)local_d0 + 0x20,(void *)0x0,0);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "-92233720368.54775808");
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_f0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_100;
  local_128 = "-92233720368.54775808";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013af1d0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = &local_128;
  local_100 = (UniValue *)local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xec155d,(size_t)&local_f8,0x10d,
             local_58,"\"-92233720368.54775808\"",&local_120);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if ((char *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48._16_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_format_monetary_values)
{
    BOOST_CHECK(ValueFromAmount(0LL).write() == "0.00000000");
    BOOST_CHECK(ValueFromAmount(1LL).write() == "0.00000001");
    BOOST_CHECK(ValueFromAmount(17622195LL).write() == "0.17622195");
    BOOST_CHECK(ValueFromAmount(50000000LL).write() == "0.50000000");
    BOOST_CHECK(ValueFromAmount(89898989LL).write() == "0.89898989");
    BOOST_CHECK(ValueFromAmount(100000000LL).write() == "1.00000000");
    BOOST_CHECK(ValueFromAmount(2099999999999990LL).write() == "20999999.99999990");
    BOOST_CHECK(ValueFromAmount(2099999999999999LL).write() == "20999999.99999999");

    BOOST_CHECK_EQUAL(ValueFromAmount(0).write(), "0.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount((COIN/10000)*123456789).write(), "12345.67890000");
    BOOST_CHECK_EQUAL(ValueFromAmount(-COIN).write(), "-1.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(-COIN/10).write(), "-0.10000000");

    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100000000).write(), "100000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10000000).write(), "10000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*1000000).write(), "1000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100000).write(), "100000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10000).write(), "10000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*1000).write(), "1000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100).write(), "100.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10).write(), "10.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN).write(), "1.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10).write(), "0.10000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100).write(), "0.01000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/1000).write(), "0.00100000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10000).write(), "0.00010000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100000).write(), "0.00001000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/1000000).write(), "0.00000100");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10000000).write(), "0.00000010");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100000000).write(), "0.00000001");

    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max()).write(), "92233720368.54775807");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 1).write(), "92233720368.54775806");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 2).write(), "92233720368.54775805");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 3).write(), "92233720368.54775804");
    // ...
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 3).write(), "-92233720368.54775805");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 2).write(), "-92233720368.54775806");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 1).write(), "-92233720368.54775807");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min()).write(), "-92233720368.54775808");
}